

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  size_t sVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  string delimiter;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_70 = (undefined1  [8])&delimiter._M_string_length;
  delimiter._M_dataplus._M_p = (pointer)0x0;
  delimiter._M_string_length._0_1_ = 0;
  bVar3 = ConsumeMessageDelimiter(this,(string *)local_70);
  if (bVar3) {
    do {
      delimiter.field_2._8_8_ = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&delimiter.field_2 + 8),">","");
      uVar5 = delimiter.field_2._8_8_;
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      if ((sVar1 == local_48) &&
         ((sVar1 == 0 ||
          (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                        (void *)delimiter.field_2._8_8_,sVar1), iVar4 == 0)))) {
        bVar3 = false;
      }
      else {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"}","");
        puVar2 = local_90;
        sVar1 = (this->tokenizer_).current_.text._M_string_length;
        if (sVar1 == local_88) {
          if (sVar1 == 0) {
            bVar3 = false;
          }
          else {
            iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_90,sVar1);
            bVar3 = iVar4 != 0;
          }
        }
        else {
          bVar3 = true;
        }
        uVar5 = delimiter.field_2._8_8_;
        if (puVar2 != local_80) {
          operator_delete(puVar2);
          uVar5 = delimiter.field_2._8_8_;
        }
      }
      if ((undefined1 *)uVar5 != local_40) {
        operator_delete((void *)uVar5);
      }
      if (!bVar3) {
        bVar3 = Consume(this,(string *)local_70);
        goto LAB_002f33d6;
      }
      bVar3 = SkipField(this);
    } while (bVar3);
  }
  bVar3 = false;
LAB_002f33d6:
  if (local_70 != (undefined1  [8])&delimiter._M_string_length) {
    operator_delete((void *)local_70);
  }
  return bVar3;
}

Assistant:

bool SkipFieldMessage() {
    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }